

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_shift.c
# Opt level: O1

int BN_lshift1(BIGNUM *r,BIGNUM *a)

{
  int iVar1;
  ulong *puVar2;
  ulong uVar3;
  BIGNUM *pBVar4;
  ulong *puVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  if (r == a) {
    pBVar4 = bn_wexpand((BIGNUM *)r,a->top + 1);
    if (pBVar4 == (BIGNUM *)0x0) {
      return 0;
    }
  }
  else {
    r->neg = a->neg;
    pBVar4 = bn_wexpand((BIGNUM *)r,a->top + 1);
    if (pBVar4 == (BIGNUM *)0x0) {
      return 0;
    }
    r->top = a->top;
  }
  puVar5 = r->d;
  iVar1 = a->top;
  if (iVar1 < 1) {
    bVar9 = true;
  }
  else {
    puVar2 = a->d;
    lVar6 = 0;
    lVar7 = 0;
    uVar8 = 0;
    do {
      uVar3 = puVar2[lVar7];
      puVar5[lVar7] = uVar8 + uVar3 * 2;
      uVar8 = uVar3 >> 0x3f;
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + -8;
    } while (iVar1 != (int)lVar7);
    bVar9 = -1 < (long)uVar3;
    puVar5 = (ulong *)((long)puVar5 - lVar6);
  }
  if (!bVar9) {
    *puVar5 = 1;
    r->top = r->top + 1;
  }
  return 1;
}

Assistant:

int BN_lshift1(BIGNUM *r, const BIGNUM *a)
{
    register BN_ULONG *ap, *rp, t, c;
    int i;

    bn_check_top(r);
    bn_check_top(a);

    if (r != a) {
        r->neg = a->neg;
        if (bn_wexpand(r, a->top + 1) == NULL)
            return (0);
        r->top = a->top;
    } else {
        if (bn_wexpand(r, a->top + 1) == NULL)
            return (0);
    }
    ap = a->d;
    rp = r->d;
    c = 0;
    for (i = 0; i < a->top; i++) {
        t = *(ap++);
        *(rp++) = ((t << 1) | c) & BN_MASK2;
        c = (t & BN_TBIT) ? 1 : 0;
    }
    if (c) {
        *rp = 1;
        r->top++;
    }
    bn_check_top(r);
    return (1);
}